

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

size_t absl::lts_20250127::container_internal::anon_unknown_2::FindEmptySlot
                 (size_t start,size_t end,ctrl_t *ctrl)

{
  bool bVar1;
  ulong local_28;
  size_t i;
  ctrl_t *ctrl_local;
  size_t end_local;
  size_t start_local;
  
  local_28 = start;
  while( true ) {
    if (end <= local_28) {
      __assert_fail("false && \"no empty slot\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                    ,199,
                    "size_t absl::container_internal::(anonymous namespace)::FindEmptySlot(size_t, size_t, const ctrl_t *)"
                   );
    }
    bVar1 = IsEmpty(ctrl[local_28]);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

size_t FindEmptySlot(size_t start, size_t end, const ctrl_t* ctrl) {
  for (size_t i = start; i < end; ++i) {
    if (IsEmpty(ctrl[i])) {
      return i;
    }
  }
  assert(false && "no empty slot");
  return ~size_t{};
}